

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int decompose_f3_ext_stem(vrna_fold_compound_t *fc,int i,int max_j,int *stems)

{
  int iVar1;
  
  iVar1 = (fc->params->model_details).min_loop_size;
  iVar1 = vrna_fun_zip_add_min
                    (stems + (long)i + (long)iVar1 + 1,
                     (fc->matrices->field_2).field_0.f5 + (long)i + (long)iVar1 + 2,
                     (max_j - iVar1) - i);
  return iVar1;
}

Assistant:

int
decompose_f3_ext_stem(vrna_fold_compound_t  *fc,
                      int                   i,
                      int                   max_j,
                      int                   *stems)
{
  int e, *f3, turn, count;

  f3    = fc->matrices->f3_local;
  turn  = fc->params->model_details.min_loop_size;
  count = max_j - i - turn;
  e     = INF;

  /* modular decomposition */
  e = vrna_fun_zip_add_min(stems + i + turn + 1, f3 + i + turn + 2, count);

  return e;
}